

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip64_stream.c
# Opt level: O0

void test_write_format_zip64_stream(void)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *buff_00;
  la_ssize_t v2;
  void *pvVar6;
  void *pvVar7;
  uchar *_v1;
  unsigned_long v2_00;
  size_t sVar8;
  uchar *puVar9;
  uchar *p_;
  unsigned_long_long uVar10;
  bool bVar11;
  char *file_name;
  char file_data [8];
  uchar *data_end;
  uchar *data_start;
  uchar *extension_end;
  uchar *extension_start;
  uchar *eocd_record;
  uchar *eocd;
  uchar *local_header;
  uchar *central_header;
  uchar *p;
  uchar *buffend;
  uchar *buff;
  short file_gid;
  short file_uid;
  int zip_compression;
  int zip_version;
  int file_perm;
  unsigned_long compressed_size;
  unsigned_long crc;
  size_t buffsize;
  size_t used;
  archive_entry *ae;
  archive *a;
  
  file_name = (char *)0x3837363534333231;
  buff_00 = malloc(1000000);
  ae = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                   ,L';',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_zip((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_zip(a)",ae);
  iVar3 = archive_write_set_options((archive *)ae,"zip:zip64");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_options(a, \"zip:zip64\")"
                      ,ae);
  iVar3 = archive_write_set_options((archive *)ae,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:experimental\")",ae);
  iVar3 = archive_write_open_memory((archive *)ae,buff_00,1000000,&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'B',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used)",ae);
  used = (size_t)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                   ,L'D',(uint)((archive_entry *)used != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)used,"file");
  archive_entry_set_mode((archive_entry *)used,0x81a4);
  archive_entry_set_uid((archive_entry *)used,10);
  archive_entry_set_gid((archive_entry *)used,0x14);
  archive_entry_set_mtime((archive_entry *)used,0,0);
  iVar3 = archive_write_header((archive *)ae,(archive_entry *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'J',0,"0",(long)iVar3,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free((archive_entry *)used);
  v2 = archive_write_data((archive *)ae,&file_name,8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'L',8,"8",v2,"archive_write_data(a, file_data, sizeof(file_data))",
                      (void *)0x0);
  iVar3 = archive_write_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",ae);
  iVar3 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",buff_00,buffsize);
  pvVar6 = (void *)((long)buff_00 + (buffsize - 0x16));
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'V',pvVar6,"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  uVar1 = i2le((void *)((long)buff_00 + (buffsize - 0x12)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'X',(ulong)uVar1,"i2le(p + 4)",0,"0",(void *)0x0);
  failure("Central dir must start on disk 0");
  uVar1 = i2le((void *)((long)buff_00 + (buffsize - 0x10)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Z',(ulong)uVar1,"i2le(p + 6)",0,"0",(void *)0x0);
  failure("All central dir entries are on this disk");
  uVar1 = i2le((void *)((long)buff_00 + (buffsize - 0xe)));
  uVar2 = i2le((void *)((long)buff_00 + (buffsize - 0xc)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\\',(ulong)uVar1,"i2le(p + 8)",(ulong)uVar2,"i2le(p + 10)",(void *)0x0);
  uVar4 = i4le((void *)((long)buff_00 + (buffsize - 10)));
  uVar5 = i4le((void *)((long)buff_00 + (buffsize - 6)));
  pvVar7 = (void *)((long)buff_00 + (ulong)uVar5 + (ulong)uVar4);
  failure("no zip comment");
  uVar1 = i2le((void *)((long)buff_00 + (buffsize - 2)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'_',(ulong)uVar1,"i2le(p + 20)",0,"0",(void *)0x0);
  uVar4 = i4le((void *)((long)buff_00 + (buffsize - 6)));
  _v1 = (uchar *)((long)buff_00 + (ulong)uVar4);
  uVar4 = i4le((void *)((long)buff_00 + (buffsize - 10)));
  failure("Central file record at offset %u should begin with PK\\001\\002 signature",(ulong)uVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'h',_v1,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar1 = i2le(_v1 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'i',(ulong)uVar1,"i2le(p + 4)",0x32d,"3 * 256 + zip_version",(void *)0x0);
  uVar1 = i2le(_v1 + 6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'j',(ulong)uVar1,"i2le(p + 6)",0x2d,"zip_version",(void *)0x0);
  uVar1 = i2le(_v1 + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'k',(ulong)uVar1,"i2le(p + 8)",8,"8",(void *)0x0);
  uVar1 = i2le(_v1 + 10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'l',(ulong)uVar1,"i2le(p + 10)",8,"zip_compression",(void *)0x0);
  uVar1 = i2le(_v1 + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'm',(ulong)uVar1,"i2le(p + 12)",0,"0",(void *)0x0);
  uVar1 = i2le(_v1 + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'n',(ulong)uVar1,"i2le(p + 14)",0x21,"33",(void *)0x0);
  v2_00 = bitcrc32(0,&file_name,8);
  uVar4 = i4le(_v1 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'p',(ulong)uVar4,"i4le(p + 16)",v2_00,"crc",(void *)0x0);
  uVar4 = i4le(_v1 + 0x14);
  uVar5 = i4le(_v1 + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'r',(ulong)uVar5,"i4le(p + 24)",8,"sizeof(file_data)",(void *)0x0);
  uVar1 = i2le(_v1 + 0x1c);
  sVar8 = strlen("file");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L's',(ulong)uVar1,"i2le(p + 28)",sVar8,"strlen(file_name)",(void *)0x0);
  uVar1 = i2le(_v1 + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'u',(ulong)uVar1,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar1 = i2le(_v1 + 0x22);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'v',(ulong)uVar1,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar1 = i2le(_v1 + 0x24);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'w',(ulong)uVar1,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar5 = i4le(_v1 + 0x26);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'x',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar5 = i4le(_v1 + 0x2a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'y',(ulong)uVar5,"i4le(p + 42)",0,"0",(void *)0x0);
  sVar8 = strlen("file");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'z',_v1 + 0x2e,"p + 46","file","file_name",sVar8,"strlen(file_name)",
                      (void *)0x0);
  sVar8 = strlen("file");
  puVar9 = _v1 + sVar8 + 0x2e;
  uVar1 = i2le(_v1 + 0x1e);
  uVar2 = i2le(puVar9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'~',(ulong)uVar2,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar2 = i2le(puVar9 + 2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x7f',(ulong)uVar2,"i2le(p + 2)",0xb,"11",(void *)0x0);
  uVar2 = i2le(puVar9 + 2);
  p_ = puVar9 + (int)(uVar2 + 4);
  uVar2 = i2le(p_);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x83',(ulong)uVar2,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  uVar2 = i2le(p_ + 2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x84',(ulong)uVar2,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x85',(ulong)p_[4],"p[4]",1,"1",(void *)0x0);
  uVar5 = i4le(p_ + 5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x86',(ulong)uVar5,"i4le(p + 5)",0,"0",(void *)0x0);
  uVar2 = i2le(p_ + 2);
  for (central_header = p_ + (int)(uVar2 + 4); central_header < puVar9 + (int)(uint)uVar1;
      central_header = central_header + (int)(uVar2 + 4)) {
    uVar2 = i2le(central_header);
    failure("Unexpected extension 0x%04X",(ulong)uVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                     ,L'\x92',L'\0',"0",(void *)0x0);
    uVar2 = i2le(central_header + 2);
  }
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
             ,L'\x97',central_header,"p",puVar9 + (int)(uint)uVar1,"extension_end",(void *)0x0);
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
             ,L'\x99',central_header,"p",pvVar7,"eocd",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x9c',central_header,"p","PK\x06\x06","\"PK\\006\\006\"",4,"4",(void *)0x0)
  ;
  uVar10 = i8le(central_header + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x9d',uVar10,"i8le(p + 4)",0x2c,"44",(void *)0x0);
  uVar1 = i2le(central_header + 0xc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x9e',(ulong)uVar1,"i2le(p + 12)",0x2d,"45",(void *)0x0);
  uVar1 = i2le(central_header + 0xe);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\x9f',(ulong)uVar1,"i2le(p + 14)",0x2d,"45",(void *)0x0);
  uVar5 = i4le(central_header + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'\xa0',(ulong)uVar5,"i4le(p + 16)",0,"0",(void *)0x0);
  uVar5 = i4le(central_header + 0x14);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¡',(ulong)uVar5,"i4le(p + 20)",0,"0",(void *)0x0);
  uVar10 = i8le(central_header + 0x18);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¢',uVar10,"i8le(p + 24)",1,"1",(void *)0x0);
  uVar10 = i8le(central_header + 0x20);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'£',uVar10,"i8le(p + 32)",1,"1",(void *)0x0);
  uVar10 = i8le(central_header + 0x28);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¤',uVar10,"i8le(p + 40)",(long)pvVar7 - (long)_v1,"eocd - central_header",
                      (void *)0x0);
  uVar10 = i8le(central_header + 0x30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¥',uVar10,"i8le(p + 48)",(long)_v1 - (long)buff_00,"central_header - buff"
                      ,(void *)0x0);
  uVar10 = i8le(central_header + 4);
  puVar9 = central_header + uVar10 + 0xc;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¨',puVar9,"p","PK\x06\a","\"PK\\006\\007\"",4,"4",(void *)0x0);
  uVar5 = i4le(puVar9 + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'©',(ulong)uVar5,"i4le(p + 4)",0,"0",(void *)0x0);
  uVar10 = i8le(puVar9 + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'ª',uVar10,"i8le(p + 8)",(long)pvVar7 - (long)buff_00,"eocd - buff",
                      (void *)0x0);
  uVar5 = i4le(puVar9 + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'«',(ulong)uVar5,"i4le(p + 16)",1,"1",(void *)0x0);
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
             ,L'¯',puVar9 + 0x14,"p",pvVar6,"eocd_record",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'³',buff_00,"p","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 4));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'´',(ulong)uVar1,"i2le(p + 4)",0x2d,"zip_version",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 6));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'µ',(ulong)uVar1,"i2le(p + 6)",8,"8",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¶',(ulong)uVar1,"i2le(p + 8)",8,"zip_compression",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'·',(ulong)uVar1,"i2le(p + 10)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¸',(ulong)uVar1,"i2le(p + 12)",0x21,"33",(void *)0x0);
  uVar5 = i4le((void *)((long)buff_00 + 0xe));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¹',(ulong)uVar5,"i4le(p + 14)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)buff_00 + 0x12));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'º',(ulong)uVar5,"i4le(p + 18)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)buff_00 + 0x16));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'»',(ulong)uVar5,"i4le(p + 22)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 0x1a));
  sVar8 = strlen("file");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¼',(ulong)uVar1,"i2le(p + 26)",sVar8,"strlen(file_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)buff_00 + 0x1c));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'½',(ulong)uVar1,"i2le(p + 28)",0x25,"37",(void *)0x0);
  sVar8 = strlen("file");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'¾',(void *)((long)buff_00 + 0x1e),"p + 30","file","file_name",sVar8,
                      "strlen(file_name)",(void *)0x0);
  sVar8 = strlen("file");
  pvVar6 = (void *)((long)buff_00 + sVar8 + 0x1e);
  uVar1 = i2le((void *)((long)buff_00 + 0x1c));
  uVar2 = i2le(pvVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Â',(ulong)uVar2,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar6 + 2));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ã',(ulong)uVar2,"i2le(p + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ä',(ulong)*(byte *)((long)pvVar6 + 4),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Å',(ulong)*(byte *)((long)pvVar6 + 5),"p[5]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar6 + 6));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Æ',(ulong)uVar5,"i4le(p + 6)",10,"file_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ç',(ulong)*(byte *)((long)pvVar6 + 10),"p[10]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar6 + 0xb));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'È',(ulong)uVar5,"i4le(p + 11)",0x14,"file_gid",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar6 + 2));
  pvVar7 = (void *)((long)pvVar6 + (long)(int)(uVar2 + 4));
  uVar2 = i2le(pvVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ë',(ulong)uVar2,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar7 + 2));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ì',(ulong)uVar2,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Í',(ulong)*(byte *)((long)pvVar7 + 4),"p[4]",1,"1",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar7 + 5));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Î',(ulong)uVar5,"i4le(p + 5)",0,"0",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar7 + 2));
  pvVar7 = (void *)((long)pvVar7 + (long)(int)(uVar2 + 4));
  uVar2 = i2le(pvVar7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ñ',(ulong)uVar2,"i2le(p)",0x6c78,"0x6c78",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar7 + 2));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ò',(ulong)uVar2,"i2le(p + 2)",9,"9",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ó',(ulong)*(byte *)((long)pvVar7 + 4),"p[4]",7,"7",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar7 + 5));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ô',(long)((int)(uint)uVar2 >> 8),"i2le(p + 5) >> 8",3,"3",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar7 + 7));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Õ',(ulong)uVar2,"i2le(p + 7)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)pvVar7 + 9));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'Ö',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 9) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar2 = i2le((void *)((long)pvVar7 + 2));
  for (central_header = (uchar *)((long)pvVar7 + (long)(int)(uVar2 + 4)); puVar9 = central_header,
      central_header < (uchar *)((long)pvVar6 + (long)(int)(uint)uVar1);
      central_header = central_header + (int)(uVar2 + 4)) {
    uVar2 = i2le(central_header);
    failure("Unexpected extension 0x%04X",(ulong)uVar2);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                     ,L'Ü',L'\0',"0",(void *)0x0);
    uVar2 = i2le(central_header + 2);
  }
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
             ,L'á',central_header,"p",(uchar *)((long)pvVar6 + (long)(int)(uint)uVar1),
             "extension_end",(void *)0x0);
  while( true ) {
    bVar11 = false;
    if (central_header < _v1) {
      bVar11 = *(int *)central_header != 0x8074b50;
    }
    if (!bVar11) break;
    central_header = central_header + 1;
  }
  file_data = (char  [8])central_header;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'è',(long)central_header - (long)puVar9,"data_end - data_start",
                      (ulong)uVar4,"compressed_size",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'é',central_header,"p","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  uVar5 = i4le(central_header + 4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'ê',(ulong)uVar5,"i4le(p + 4)",v2_00,"crc",(void *)0x0);
  uVar10 = i8le(central_header + 8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'ë',uVar10,"i8le(p + 8)",(ulong)uVar4,"compressed_size",(void *)0x0);
  uVar10 = i8le(central_header + 0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
                      ,L'ì',uVar10,"i8le(p + 16)",8,"sizeof(file_data)",(void *)0x0);
  assertion_equal_address
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_zip64_stream.c"
             ,L'ï',central_header + 0x18,"p + 24",_v1,"central_header",(void *)0x0);
  free(buff_00);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip64_stream)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t used, buffsize = 1000000;
	unsigned long crc;
	unsigned long compressed_size = 0;
	int file_perm = 00644;
	int zip_version = 45;
	int zip_compression = 8;
	short file_uid = 10, file_gid = 20;
	unsigned char *buff, *buffend, *p;
	unsigned char *central_header, *local_header, *eocd, *eocd_record;
	unsigned char *extension_start, *extension_end;
	unsigned char *data_start, *data_end;
	char file_data[] = {'1', '2', '3', '4', '5', '6', '7', '8'};
	const char *file_name = "file";

#ifndef HAVE_ZLIB_H
	zip_compression = 0;
#endif

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:zip64"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, file_name);
	archive_entry_set_mode(ae, AE_IFREG | file_perm);
	archive_entry_set_uid(ae, file_uid);
	archive_entry_set_gid(ae, file_gid);
	archive_entry_set_mtime(ae, 0, 0);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, file_data, sizeof(file_data)));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	buffend = buff + used;
	dumpfile("constructed.zip", buff, used);

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	eocd_record = p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2le(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2le(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2le(p + 8), i2le(p + 10));
	eocd = buff + i4le(p + 12) + i4le(p + 16);
	failure("no zip comment");
	assertEqualInt(i2le(p + 20), 0);

	/* Get address of first entry in central directory. */
	central_header = p = buff + i4le(buffend - 6);
	failure("Central file record at offset %u should begin with"
	    " PK\\001\\002 signature",
	    i4le(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + zip_version); /* Version made by */
	assertEqualInt(i2le(p + 6), zip_version); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), 8); /* Flags */
	assertEqualInt(i2le(p + 10), zip_compression); /* Compression method */
	assertEqualInt(i2le(p + 12), 0); /* File time */
	assertEqualInt(i2le(p + 14), 33); /* File date */
	crc = bitcrc32(0, file_data, sizeof(file_data));
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	compressed_size = i4le(p + 20);  /* Compressed size */
	assertEqualInt(i4le(p + 24), sizeof(file_data)); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(file_name)); /* Pathname length */
	/* assertEqualInt(i2le(p + 30), 28); */ /* Extra field length: See below */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = central_header + 46 + strlen(file_name);
	extension_end = extension_start + i2le(central_header + 30);

	assertEqualInt(i2le(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	/* TODO: verify 'ux' contents */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), 0); /* 'UT' mtime */
	p += 4 + i2le(p + 2);

	/* Note: We don't expect to see zip64 extension in the central
	 * directory, since the writer knows the actual full size by
	 * the time it is ready to write the central directory and has
	 * no reason to insert it then.  Info-Zip seems to do the same
	 * thing. */

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2le(p));
		assert(0);
		p += 4 + i2le(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assertEqualAddress(p, extension_end);

	assertEqualAddress(p, eocd);

	/* After Central dir, we find Zip64 eocd and Zip64 eocd locator. */
	assertEqualMem(p, "PK\006\006", 4); /* Zip64 eocd */
	assertEqualInt(i8le(p + 4), 44); /* We're using v1 Zip64 eocd */
	assertEqualInt(i2le(p + 12), 45); /* Written by Version 4.5 */
	assertEqualInt(i2le(p + 14), 45); /* Needs version 4.5 to extract */
	assertEqualInt(i4le(p + 16), 0); /* This is disk #0 */
	assertEqualInt(i4le(p + 20), 0); /* Dir starts on disk #0 */
	assertEqualInt(i8le(p + 24), 1); /* 1 entry on this disk */
	assertEqualInt(i8le(p + 32), 1); /* 1 entry total */
	assertEqualInt(i8le(p + 40), eocd - central_header); /* size of cd */
	assertEqualInt(i8le(p + 48), central_header - buff); /* start of cd */
	p += 12 + i8le(p + 4);

	assertEqualMem(p, "PK\006\007", 4); /* Zip64 eocd locator */
	assertEqualInt(i4le(p + 4), 0); /* Zip64 eocd is on disk #0 */
	assertEqualInt(i8le(p + 8), eocd - buff); /* Offset of Zip64 eocd */
	assertEqualInt(i4le(p + 16), 1); /* 1 disk */
	p += 20;

	/* Regular EOCD immediately follows Zip64 records. */
	assertEqualAddress(p, eocd_record);

	/* Verify local header of file entry. */
	p = local_header = buff;
	assertEqualMem(p, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(p + 4), zip_version); /* Version needed to extract */
	assertEqualInt(i2le(p + 6), 8); /* Flags: bit 3 = length-at-end */
	assertEqualInt(i2le(p + 8), zip_compression); /* Compression method */
	assertEqualInt(i2le(p + 10), 0); /* File time */
	assertEqualInt(i2le(p + 12), 33); /* File date */
	assertEqualInt(i4le(p + 14), 0); /* CRC-32 */
	assertEqualInt(i4le(p + 18), 0); /* Compressed size must be zero for length-at-end */
	assertEqualInt(i4le(p + 22), 0); /* Uncompressed size must be zero for length-at-end */
	assertEqualInt(i2le(p + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(p + 28), 37); /* Extra field length */
	assertEqualMem(p + 30, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = local_header + 30 + strlen(file_name);
	extension_end = extension_start + i2le(local_header + 28);

	assertEqualInt(i2le(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), 0); /* 'UT' mtime */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x6c78); /* 'xl' experimental extension header */
	assertEqualInt(i2le(p + 2), 9); /* size */
	assertEqualInt(p[4], 7); /* bitmap of included fields */
	assertEqualInt(i2le(p + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2le(p + 7), 0); /* internal file attributes */
	assertEqualInt(i4le(p + 9) >> 16 & 01777, file_perm); /* external file attributes */
	p += 4 + i2le(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2le(p));
		assert(0);
		p += 4 + i2le(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assertEqualAddress(p, extension_end);
	data_start = p;

	/* Data descriptor should follow compressed data. */
	while (p < central_header && memcmp(p, "PK\007\010", 4) != 0)
		++p;
	data_end = p;
	assertEqualInt(data_end - data_start, compressed_size);
	assertEqualMem(p, "PK\007\010", 4);
	assertEqualInt(i4le(p + 4), crc); /* CRC-32 */
	assertEqualInt(i8le(p + 8), compressed_size); /* compressed size */
	assertEqualInt(i8le(p + 16), sizeof(file_data)); /* uncompressed size */

	/* Central directory should immediately follow the only entry. */
	assertEqualAddress(p + 24, central_header);

	free(buff);
}